

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O3

void __thiscall wasm::CoalesceLocals::calculateInterferences(CoalesceLocals *this)

{
  ulong *puVar1;
  uint uVar2;
  BasicBlock *pBVar3;
  uint *puVar4;
  Expression *expr;
  uint32_t i;
  pointer puVar5;
  void *pvVar6;
  WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
  *pWVar7;
  bool bVar8;
  int iVar9;
  Index IVar10;
  const_iterator cVar11;
  pointer pLVar12;
  size_t sVar13;
  Type type;
  size_t sVar14;
  uint j_00;
  iterator __begin3;
  __node_base_ptr p_Var15;
  ulong uVar16;
  Index j;
  long lVar17;
  Function *this_00;
  uint *puVar18;
  uint uVar19;
  ulong uVar20;
  Literals local_180;
  undefined1 local_148 [8];
  ValueNumbering valueNumbering;
  vector<bool,_std::allocator<bool>_> local_b8;
  pointer local_90;
  __node_base_ptr local_88;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Type local_60;
  BasicBlock *local_58;
  undefined1 local_50 [8];
  SetOfLocals live;
  
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->interferences;
  sparse_square_matrix<bool>::recreate
            ((sparse_square_matrix<bool> *)
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             numLocals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
             (ulong)(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .numLocals,(allocator_type *)local_148);
  local_148._0_4_ = 0;
  valueNumbering._0_8_ = &valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.literalValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.literalValues._M_h._M_bucket_count = 0;
  valueNumbering.literalValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.literalValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.literalValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize = 0;
  valueNumbering.literalValues._M_h._M_single_bucket =
       (__node_base_ptr)&valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.expressionValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.expressionValues._M_h._M_bucket_count = 0;
  valueNumbering.expressionValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.expressionValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
            .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
            super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
            currFunction;
  p_Var15 = (__node_base_ptr)
            (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  valueNumbering.expressionValues._M_h._M_single_bucket =
       *(__node_base_ptr *)
        ((long)&(this->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .basicBlocks.
                super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data + 8);
  live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  if (p_Var15 != valueNumbering.expressionValues._M_h._M_single_bucket) {
    pWVar7 = &this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
    ;
    do {
      local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
              *)&p_Var15->_M_nxt)->
           super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
           )._M_t.
           super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
           .
           super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
           ._M_head_impl;
      cVar11 = std::
               _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(pWVar7->
                       super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                       ).liveBlocks._M_h,(key_type *)&local_b8);
      if (cVar11.
          super__Node_iterator_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_cur != (__node_type *)0x0) {
        local_58 = (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                      *)&p_Var15->_M_nxt)->
                   super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                   )._M_t.
                   super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                   .
                   super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                   ._M_head_impl;
        local_50[0] = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_b8,
                   ((long)*(pointer *)((long)&(local_58->contents).actions + 8) -
                    *(long *)&(local_58->contents).actions.
                              super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                              ._M_impl >> 3) * -0x5555555555555555,(bool *)local_50,
                   (allocator_type *)&local_60);
        local_88 = p_Var15;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                   &(((((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                         *)&p_Var15->_M_nxt)->
                      super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      .
                      super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                     ._M_head_impl)->contents).end.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
        uVar19 = (int)((long)*(pointer *)
                              ((long)&(local_58->contents).actions.
                                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                      ._M_impl + 8) -
                       (long)(local_58->contents).actions.
                             super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
        if (0 < (int)uVar19) {
          uVar16 = (ulong)(uVar19 & 0x7fffffff);
          uVar20 = uVar16 + 1;
          lVar17 = uVar16 * 0x18 + -8;
          do {
            pLVar12 = (local_58->contents).actions.
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            IVar10 = *(Index *)((long)pLVar12 + lVar17 + -0xc);
            if (*(int *)((long)pLVar12 + lVar17 + -0x10) == 0) {
              bVar8 = SortedVector::has((SortedVector *)local_50,IVar10);
              if (!bVar8) {
                puVar1 = (ulong *)((long)&(((Liveness *)
                                           local_b8.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p)->start).
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (uVar20 - 2 >> 6 & 0x3ffffff) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)(uVar20 - 2) & 0x3f);
                SortedVector::insert((SortedVector *)local_50,IVar10);
              }
            }
            else {
              bVar8 = SortedVector::erase((SortedVector *)local_50,IVar10);
              if (bVar8) {
                *(undefined1 *)((long)&pLVar12->what + lVar17) = 1;
              }
            }
            uVar20 = uVar20 - 1;
            lVar17 = lVar17 + -0x18;
          } while (1 < uVar20);
        }
        pBVar3 = (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                    *)&local_88->_M_nxt)->
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
        puVar5 = (pointer)CONCAT71(local_50._1_7_,local_50[0]);
        puVar18 = *(uint **)&(pBVar3->contents).start;
        puVar4 = *(pointer *)((long)&(pBVar3->contents).start + 8);
        if (((long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)puVar5 != (long)puVar4 - (long)puVar18)
           || ((live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != puVar5 &&
               (iVar9 = bcmp(puVar5,puVar18,
                             (long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)puVar5),
               iVar9 != 0)))) {
          __assert_fail("live == curr->contents.start",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                        ,0xca,"void wasm::CoalesceLocals::calculateInterferences()");
        }
        if (pBVar3 == *(BasicBlock **)
                       (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x4c)) {
          for (uVar16 = 0; sVar14 = Function::getNumParams(this_00), uVar16 < sVar14;
              uVar16 = (ulong)((int)uVar16 + 1)) {
            *(undefined4 *)((long)local_80 + uVar16 * 4) = local_148._0_4_;
            local_148._0_4_ = local_148._0_4_ + 1;
          }
          sVar14 = Function::getNumParams(this_00);
          while( true ) {
            sVar13 = Function::getNumLocals(this_00);
            uVar16 = sVar14 & 0xffffffff;
            if (sVar13 <= uVar16) break;
            type = Function::getLocalType(this_00,(Index)sVar14);
            local_60 = type;
            bVar8 = wasm::Type::isDefaultable(&local_60);
            if (bVar8) {
              Literal::makeZeros(&local_180,type);
              IVar10 = ValueNumbering::getValue((ValueNumbering *)local_148,&local_180);
              *(Index *)((long)local_80 + uVar16 * 4) = IVar10;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        (&local_180.super_SmallVector<wasm::Literal,_1UL>.flexible);
              Literal::~Literal(local_180.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
            }
            else {
              *(undefined4 *)((long)local_80 + uVar16 * 4) = local_148._0_4_;
              local_148._0_4_ = local_148._0_4_ + 1;
            }
            sVar14 = (size_t)((Index)sVar14 + 1);
          }
        }
        else {
          for (; puVar18 != puVar4; puVar18 = puVar18 + 1) {
            *(undefined4 *)((long)local_80 + (ulong)*puVar18 * 4) = local_148._0_4_;
            local_148._0_4_ = local_148._0_4_ + 1;
          }
        }
        pLVar12 = (local_58->contents).actions.
                  super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((local_58->contents).actions.
            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>._M_impl.
            super__Vector_impl_data._M_finish != pLVar12) {
          uVar16 = 0;
          do {
            uVar19 = pLVar12[uVar16].index;
            iVar9 = (int)uVar16;
            if (pLVar12[uVar16].what == Get) {
              if (((*(ulong *)((long)&(((Liveness *)
                                       local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p)->start).
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar16 >> 6) * 8)
                    >> (uVar16 & 0x3f) & 1) != 0) &&
                 (bVar8 = SortedVector::erase((SortedVector *)local_50,uVar19), !bVar8)) {
                __assert_fail("erased",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                              ,0xf8,"void wasm::CoalesceLocals::calculateInterferences()");
              }
            }
            else {
              local_90 = pLVar12 + uVar16;
              if ((*local_90->origin)->_id != LocalSetId) {
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                              ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
              }
              expr = (Expression *)(*local_90->origin)[1].type.id;
              if ((expr->_id & ~BlockId) == LocalGetId) {
                if ((iVar9 == 0) || (expr != *pLVar12[iVar9 - 1U].origin)) {
                  __assert_fail("i > 0 && set->value == *actions[i - 1].origin",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                                ,0x103,"void wasm::CoalesceLocals::calculateInterferences()");
                }
                IVar10 = *(Index *)((long)local_80 + (ulong)pLVar12[iVar9 - 1U].index * 4);
              }
              else {
                IVar10 = ValueNumbering::getValue((ValueNumbering *)local_148,expr);
              }
              puVar5 = live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(Index *)((long)local_80 + (ulong)uVar19 * 4) = IVar10;
              if (local_90->effective == true) {
                for (puVar18 = (uint *)CONCAT71(local_50._1_7_,local_50[0]); puVar18 != puVar5;
                    puVar18 = puVar18 + 1) {
                  uVar2 = *puVar18;
                  if (uVar2 == uVar19) {
                    __assert_fail("other != index",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                                  ,0x118,"void wasm::CoalesceLocals::calculateInterferences()");
                  }
                  if (*(Index *)((long)local_80 + (ulong)uVar2 * 4) != IVar10) {
                    j_00 = uVar2;
                    i = uVar19;
                    if (uVar2 <= uVar19) {
                      j_00 = uVar19;
                      i = uVar2;
                    }
                    local_60.id._0_1_ = 1;
                    sparse_square_matrix<bool>::set
                              ((sparse_square_matrix<bool> *)
                               values.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,i,j_00,
                               (bool *)&local_60);
                  }
                }
                SortedVector::insert((SortedVector *)local_50,local_90->index);
              }
            }
            uVar16 = (ulong)(iVar9 + 1);
            pLVar12 = (local_58->contents).actions.
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar20 = ((long)(local_58->contents).actions.
                            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar12 >> 3) *
                     -0x5555555555555555;
          } while (uVar16 <= uVar20 && uVar20 - uVar16 != 0);
        }
        pvVar6 = (void *)CONCAT71(local_50._1_7_,local_50[0]);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,(long)live.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6);
        }
        this = (CoalesceLocals *)
               live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        p_Var15 = local_88;
        if ((BasicBlock *)
            local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (BasicBlock *)0x0) {
          operator_delete(local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
        }
      }
      p_Var15 = p_Var15 + 1;
    } while (p_Var15 != valueNumbering.expressionValues._M_h._M_single_bucket);
    this_00 = (this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .
              super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              currFunction;
  }
  sVar14 = Function::getNumParams(this_00);
  if (sVar14 != 0) {
    IVar10 = 0;
    do {
      uVar20 = (ulong)(IVar10 + 1);
      uVar16 = uVar20;
      if (sVar14 <= uVar20) break;
      do {
        interfereLowHigh((CoalesceLocals *)
                         live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,IVar10,(Index)uVar16);
        uVar16 = (ulong)((Index)uVar16 + 1);
      } while (uVar16 < sVar14);
      IVar10 = IVar10 + 1;
    } while (uVar20 < sVar14);
  }
  puVar18 = (uint *)**(undefined8 **)
                      (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x4c);
  values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(*(undefined8 **)
                  (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x4c))[1];
  if (puVar18 !=
      values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    do {
      uVar19 = *puVar18;
      if (sVar14 - 1 < (ulong)uVar19) {
        uVar16 = 0;
        do {
          interfereLowHigh((CoalesceLocals *)
                           live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(Index)uVar16,uVar19);
          uVar16 = (ulong)((Index)uVar16 + 1);
        } while (uVar16 < sVar14);
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 !=
             values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&valueNumbering.literalValues._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&valueNumbering);
  if (local_80 != (undefined1  [8])0x0) {
    operator_delete((void *)local_80,
                    (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_80);
  }
  return;
}

Assistant:

void CoalesceLocals::calculateInterferences() {
  interferences.recreate(numLocals);

  // We will track the values in each local, using a numbering where each index
  // represents a unique different value. This array maps a local index to the
  // value index it contains.
  //
  // To avoid reallocating this array all the time, allocate it once outside the
  // loop.
  std::vector<Index> values(numLocals);

  ValueNumbering valueNumbering;

  auto* func = getFunction();

  for (auto& curr : basicBlocks) {
    if (liveBlocks.count(curr.get()) == 0) {
      continue; // ignore dead blocks
    }

    // First, find which gets end a live range. While doing so, also calculate
    // the effectiveness of sets.
    auto& actions = curr->contents.actions;
    std::vector<bool> endsLiveRange(actions.size(), false);
    auto live = curr->contents.end;
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (!live.has(index)) {
          // The local is not live after us, so its liveness ends here.
          endsLiveRange[i] = true;
          live.insert(index);
        }
      } else {
        // This is a set. Check if the local is alive after it; if it is then
        // the set if effective as there is some get that can read the value.
        if (live.erase(index)) {
          action.effective = true;
        }
      }
    }

    // We have processed from the end of the block to the start, updating |live|
    // as we go, and now it must be equal to the state at the start of the
    // block. We will also use |live| in the next loop, and assume it begins
    // in that state.
    assert(live == curr->contents.start);

    // Now that we know live ranges, check if locals interfere in this block.
    // Locals interfere if they might contain different values on areas where
    // their live ranges overlap. To evaluate that, we do an analysis inside
    // the block that gives each set a unique value number, and as those flow
    // around through copies between sets we can see when sets are guaranteed to
    // be equal.

    if (curr.get() == entry) {
      // Each parameter is assumed to have a different value on entry.
      for (Index i = 0; i < func->getNumParams(); i++) {
        values[i] = valueNumbering.getUniqueValue();
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto type = func->getLocalType(i);
        if (!LiteralUtils::canMakeZero(type)) {
          // The default value for a type for which we can't make a zero cannot
          // be used anyhow, but we must give it some value in this analysis. A
          // unique one seems least likely to result in surprise during
          // debugging.
          values[i] = valueNumbering.getUniqueValue();
        } else {
          values[i] = valueNumbering.getValue(Literal::makeZeros(type));
        }
      }
    } else {
      // In any block but the entry, assume that each live local might have a
      // different value at the start.
      // TODO: Propagating value IDs across blocks could identify more copies,
      //       however, it would also be nonlinear.
      for (auto index : curr->contents.start) {
        values[index] = valueNumbering.getUniqueValue();
      }
    }

    // Traverse through the block from start to finish. We keep track of both
    // liveness (in |live|) and the value IDs in each local (in |values|)
    // while doing so.
    for (Index i = 0; i < actions.size(); i++) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (endsLiveRange[i]) {
          [[maybe_unused]] bool erased = live.erase(action.index);
          assert(erased);
        }
        continue;
      }

      // This is a set. Find the value being assigned to the local.
      auto* set = (*action.origin)->cast<LocalSet>();
      Index newValue;
      if (set->value->is<LocalGet>() || set->value->is<LocalSet>()) {
        // This is a copy: Either it is a get or a tee, that occurs right
        // before us. Set our new value to theirs.
        assert(i > 0 && set->value == *actions[i - 1].origin);
        newValue = values[actions[i - 1].index];
      } else {
        // This is not a copy.
        newValue = valueNumbering.getValue(set->value);
      }
      values[index] = newValue;

      // If this set has no gets that read from it, then it does not start a
      // live range, and it cannot cause interference.
      if (!action.effective) {
        continue;
      }

      // Update interferences: This will interfere with any other local that
      // is currently live and contains a different value.
      for (auto other : live) {
        // This index cannot have been live before this set (as we would be
        // trampling some other set before us, if so; and then that set would
        // have been ineffective). We will mark this index as live right after
        // this loop).
        assert(other != index);
        if (values[other] != newValue) {
          interfere(other, index);
        }
      }
      live.insert(action.index);
    }

    // Note that we do not need to do anything for merges: while in general an
    // interference can happen either in a block or when control flow merges,
    // in wasm we have default values for all locals. As a result, if a local is
    // live at the beginning of a block, it will be live at the ends of *all*
    // the blocks reaching it: there is no possibility of an "unset local." That
    // is, imagine we have this merge with a conflict:
    //
    //  [a is set to some value] ->-
    //                              |
    //                              |->- [merge block where a and b are used]
    //                              |
    //  [b is set to some value] ->-
    //
    // It is true that a conflict happens in the merge block, and if we had
    // unset locals then the top block would have b unset, and the bottom block
    // would have a unset, and so there would be no conflict there and the
    // problem would only appear in the merge. But in wasm, that a and b are
    // used in the merge block means that they are live at the end of both the
    // top and bottom block, and that liveness will extend all the way back to
    // *some* set of those values, possibly only the zero-initialization at the
    // function start. Therefore a conflict will be noticed in both the top and
    // bottom blocks, and that merge block does not need to reason about merging
    // its inputs. In other words, a conflict will appear in the middle of a
    // block, somewhere, and therefore we leave it to that block to identify,
    // and so blocks only need to reason about their own contents and not what
    // arrives to them.
    //
    // The one exception here is the entry to the function, see below.
  }

  // We must not try to coalesce parameters as they are fixed. Mark them as
  // "interfering" so that we do not need to special-case them later.
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    for (Index j = i + 1; j < numParams; j++) {
      interfereLowHigh(i, j);
    }
  }

  // We must handle interference between uses of the zero-init value and
  // parameters manually. A zero initialization represents a set (to a default
  // value), and that set would be what alerts us to a conflict, but there is no
  // actual set in the IR since the zero-init value is applied implicitly.
  for (auto i : entry->contents.start) {
    if (i >= numParams) {
      for (Index j = 0; j < numParams; j++) {
        interfereLowHigh(j, i);
      }
    }
  }
}